

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

void __thiscall HPresolve::testAnAR(HPresolve *this,int post)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  vector<int,_std::allocator<int>_> *this_02;
  vector<int,_std::allocator<int>_> *this_03;
  vector<int,_std::allocator<int>_> *this_04;
  vector<int,_std::allocator<int>_> *pvVar1;
  vector<int,_std::allocator<int>_> *this_05;
  vector<int,_std::allocator<int>_> *this_06;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  byte bVar5;
  HPresolve *pHVar6;
  ulong uVar7;
  reference pvVar8;
  uint *puVar9;
  reference pvVar10;
  ostream *poVar11;
  ulong uVar12;
  size_type sVar13;
  size_type sVar14;
  size_type sVar15;
  int iVar16;
  ulong uVar17;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double local_a8;
  double local_a0;
  
  pHVar6 = (HPresolve *)&(this->super_HPreData).numColOriginal;
  if (post == 0) {
    pHVar6 = this;
  }
  uVar2 = (pHVar6->super_HPreData).numCol;
  uVar3 = (&(this->super_HPreData).numRow)[post != 0];
  this_02 = &(this->super_HPreData).flagRow;
  this_03 = &(this->super_HPreData).flagCol;
  this_00 = &(this->super_HPreData).Astart;
  this_04 = &(this->super_HPreData).Aend;
  this_01 = &(this->super_HPreData).Aindex;
  pvVar1 = &(this->super_HPreData).ARstart;
  this_05 = &(this->super_HPreData).ARindex;
  uVar17 = 0;
  uVar7 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar7 = uVar17;
  }
  local_a0 = in_XMM0_Qa;
  local_a8 = in_XMM1_Qa;
  uVar12 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar12 = uVar17;
  }
  do {
    sVar13 = uVar17;
    if (sVar13 == uVar12) {
      if (post == 0) {
        this_06 = &(this->super_HPreData).nzRow;
        sVar13 = 0;
        while (sVar14 = sVar13, sVar14 != uVar12) {
          pvVar8 = std::vector<int,_std::allocator<int>_>::at(this_02,sVar14);
          if (*pvVar8 == 0) {
            sVar13 = sVar14 + 1;
          }
          else {
            pvVar8 = std::vector<int,_std::allocator<int>_>::at(pvVar1,sVar14);
            sVar13 = sVar14 + 1;
            iVar16 = 0;
            for (sVar15 = (size_type)*pvVar8;
                pvVar8 = std::vector<int,_std::allocator<int>_>::at(pvVar1,sVar13),
                (long)sVar15 < (long)*pvVar8; sVar15 = sVar15 + 1) {
              pvVar8 = std::vector<int,_std::allocator<int>_>::at(this_05,sVar15);
              pvVar8 = std::vector<int,_std::allocator<int>_>::at(this_03,(long)*pvVar8);
              iVar16 = (iVar16 + 1) - (uint)(*pvVar8 == 0);
            }
            pvVar8 = std::vector<int,_std::allocator<int>_>::at(this_06,sVar14);
            if (iVar16 != *pvVar8) {
              poVar11 = std::operator<<((ostream *)&std::cout,"    NZ ROW      DIFF row=");
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,(int)sVar14);
              poVar11 = std::operator<<(poVar11," nzRow=");
              pvVar8 = std::vector<int,_std::allocator<int>_>::at(this_06,sVar14);
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,*pvVar8);
              poVar11 = std::operator<<(poVar11," actually ");
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar16);
              poVar11 = std::operator<<(poVar11,"------------");
              std::endl<char,std::char_traits<char>>(poVar11);
            }
          }
        }
        pvVar1 = &(this->super_HPreData).nzCol;
        for (sVar13 = 0; sVar13 != uVar7; sVar13 = sVar13 + 1) {
          pvVar8 = std::vector<int,_std::allocator<int>_>::at(this_03,sVar13);
          if (*pvVar8 != 0) {
            pvVar8 = std::vector<int,_std::allocator<int>_>::at(this_00,sVar13);
            iVar16 = 0;
            for (sVar14 = (size_type)*pvVar8;
                pvVar8 = std::vector<int,_std::allocator<int>_>::at(this_04,sVar13),
                (long)sVar14 < (long)*pvVar8; sVar14 = sVar14 + 1) {
              pvVar8 = std::vector<int,_std::allocator<int>_>::at(this_01,sVar14);
              pvVar8 = std::vector<int,_std::allocator<int>_>::at(this_02,(long)*pvVar8);
              iVar16 = (iVar16 + 1) - (uint)(*pvVar8 == 0);
            }
            pvVar8 = std::vector<int,_std::allocator<int>_>::at(pvVar1,sVar13);
            if (iVar16 != *pvVar8) {
              poVar11 = std::operator<<((ostream *)&std::cout,"    NZ COL      DIFF col=");
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,(int)sVar13);
              poVar11 = std::operator<<(poVar11," nzCol=");
              pvVar8 = std::vector<int,_std::allocator<int>_>::at(pvVar1,sVar13);
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,*pvVar8);
              poVar11 = std::operator<<(poVar11," actually ");
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar16);
              poVar11 = std::operator<<(poVar11,"------------");
              std::endl<char,std::char_traits<char>>(poVar11);
            }
          }
        }
      }
      return;
    }
    for (sVar14 = 0; uVar17 = sVar13 + 1, sVar14 != uVar7; sVar14 = sVar14 + 1) {
      if ((post != 0) ||
         ((pvVar8 = std::vector<int,_std::allocator<int>_>::at(this_02,sVar13), *pvVar8 != 0 &&
          (pvVar8 = std::vector<int,_std::allocator<int>_>::at(this_03,sVar14), *pvVar8 != 0)))) {
        pvVar8 = std::vector<int,_std::allocator<int>_>::at(this_00,sVar14);
        bVar4 = false;
        for (sVar15 = (size_type)*pvVar8;
            pvVar8 = std::vector<int,_std::allocator<int>_>::at(this_04,sVar14),
            (long)sVar15 < (long)*pvVar8; sVar15 = sVar15 + 1) {
          puVar9 = (uint *)std::vector<int,_std::allocator<int>_>::at(this_01,sVar15);
          if (sVar13 == *puVar9) {
            pvVar10 = std::vector<double,_std::allocator<double>_>::at
                                (&(this->super_HPreData).Avalue,sVar15);
            local_a0 = *pvVar10;
            bVar4 = true;
          }
        }
        pvVar8 = std::vector<int,_std::allocator<int>_>::at(pvVar1,sVar13);
        bVar5 = 0;
        for (sVar15 = (size_type)*pvVar8;
            pvVar8 = std::vector<int,_std::allocator<int>_>::at(pvVar1,sVar13 + 1),
            (long)sVar15 < (long)*pvVar8; sVar15 = sVar15 + 1) {
          puVar9 = (uint *)std::vector<int,_std::allocator<int>_>::at(this_05,sVar15);
          if (sVar14 == *puVar9) {
            pvVar10 = std::vector<double,_std::allocator<double>_>::at
                                (&(this->super_HPreData).ARvalue,sVar15);
            local_a8 = *pvVar10;
            bVar5 = 1;
          }
        }
        if ((bool)(bVar5 ^ bVar4)) {
          poVar11 = std::operator<<((ostream *)&std::cout,"    MATRIX is0   DIFF row=");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,(int)sVar13);
          poVar11 = std::operator<<(poVar11," col=");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,(int)sVar14);
          poVar11 = std::operator<<(poVar11,"           ------------A: ");
          poVar11 = std::ostream::_M_insert<bool>(SUB81(poVar11,0));
          poVar11 = std::operator<<(poVar11,"  AR: ");
          poVar11 = std::ostream::_M_insert<bool>(SUB81(poVar11,0));
LAB_00143fc0:
          std::endl<char,std::char_traits<char>>(poVar11);
        }
        else if (bVar4) {
          if ((local_a0 != local_a8) || (NAN(local_a0) || NAN(local_a8))) {
            poVar11 = std::operator<<((ostream *)&std::cout,"    MATRIX VAL  DIFF row=");
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,(int)sVar13);
            poVar11 = std::operator<<(poVar11," col=");
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,(int)sVar14);
            std::operator<<(poVar11,"           ------------A: ");
            poVar11 = std::ostream::_M_insert<double>(local_a0);
            std::operator<<(poVar11,"  AR: ");
            poVar11 = std::ostream::_M_insert<double>(local_a8);
            goto LAB_00143fc0;
          }
        }
      }
    }
  } while( true );
}

Assistant:

void HPresolve::testAnAR(int post) {
	int rows = numRow;
	int cols = numCol;
	int i,j,k;

	double valueA, valueAR;
	bool hasValueA, hasValueAR;

	if (post) {
		rows = numRowOriginal;
		cols = numColOriginal;
	}

	// check that A = AR
	for (i=0; i<rows; ++i) {
		for (j=0; j<cols; ++j) {
			if (post==0)
				if (!flagRow.at(i) || !flagCol.at(j))
				continue;
			hasValueA = false;
			for (k = Astart.at(j); k<Aend.at(j);++k )
				if (Aindex.at(k) == i) {
					hasValueA = true;
					valueA = Avalue.at(k);
				}

			hasValueAR = false;
			for (k = ARstart.at(i); k<ARstart.at(i+1);++k )
				if (ARindex.at(k) == j) {
					hasValueAR = true;
					valueAR = ARvalue.at(k);
				}

			if (hasValueA != hasValueAR)
				cout<<"    MATRIX is0   DIFF row="<<i<< " col="<<j<<"           ------------A: "<<hasValueA<<"  AR: "<<hasValueAR <<endl;
			else if (hasValueA && valueA != valueAR)
				cout<<"    MATRIX VAL  DIFF row="<<i<< " col="<<j<<"           ------------A: "<<valueA<<"  AR: "<<valueAR <<endl;
		}
	}

	if (post == 0) {
		//check nz
		int nz=0;
		for (i=0; i<rows; ++i) {
			if (!flagRow.at(i))
				continue;
			nz=0;
			for (k = ARstart.at(i); k<ARstart.at(i+1);++k )
				if (flagCol.at(ARindex.at(k)))
					nz++;
			if (nz != nzRow.at(i))
				cout<<"    NZ ROW      DIFF row="<<i<< " nzRow="<<nzRow.at(i)<<" actually "<<nz <<"------------"<<endl;
		}

		for (j=0; j<cols; ++j) {
			if (!flagCol.at(j))
				continue;
			nz=0;
			for (k = Astart.at(j); k<Aend.at(j);++k )
				if (flagRow.at(Aindex.at(k)))
					nz++;
			if (nz != nzCol.at(j))
				cout<<"    NZ COL      DIFF col="<<j<< " nzCol="<<nzCol.at(j)<<" actually "<<nz <<"------------"<<endl;
		}
	}

}